

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DockNodeAddWindow(ImGuiDockNode *node,ImGuiWindow_conflict *window,_Bool add_to_tab_bar)

{
  ImGuiID IVar1;
  ImGuiDockNode *node_00;
  ImGuiWindow_conflict *pIVar2;
  ushort uVar3;
  ImGuiWindow_conflict **ppIVar4;
  ushort uVar5;
  int n;
  int i;
  ImGuiTabBar *pIVar6;
  bool bVar7;
  bool bVar8;
  ImGuiWindow *local_28;
  
  node_00 = window->DockNode;
  local_28 = (ImGuiWindow *)window;
  if (node_00 != (ImGuiDockNode *)0x0) {
    if (node_00->ID == node->ID) {
      __assert_fail("window->DockNode->ID != node->ID",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                    ,0x34ce,"void ImGui::DockNodeAddWindow(ImGuiDockNode *, ImGuiWindow *, bool)");
    }
    DockNodeRemoveWindow(node_00,window,0);
    if ((window->DockNode != (ImGuiDockNode *)0x0) &&
       (window->DockNodeAsHost != (ImGuiDockNode *)0x0)) {
      __assert_fail("window->DockNode == __null || window->DockNodeAsHost == __null",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                    ,0x34d1,"void ImGui::DockNodeAddWindow(ImGuiDockNode *, ImGuiWindow *, bool)");
    }
  }
  if ((node->HostWindow == (ImGuiWindow_conflict *)0x0) && ((node->Windows).Size == 1)) {
    ppIVar4 = ImVector<ImGuiWindow_*>::operator[](&node->Windows,0);
    if ((*ppIVar4)->WasActive == false) {
      ppIVar4 = ImVector<ImGuiWindow_*>::operator[](&node->Windows,0);
      pIVar2 = *ppIVar4;
      pIVar2->Hidden = true;
      pIVar2->HiddenFramesCanSkipItems = '\x02' - pIVar2->Active;
    }
  }
  ImVector<ImGuiWindow_*>::push_back(&node->Windows,(ImGuiWindow_conflict **)&local_28);
  node->field_0xbe = node->field_0xbe | 2;
  local_28->DockNode = node;
  local_28->DockId = node->ID;
  local_28->field_0x3e1 = local_28->field_0x3e1 & 0xf6 | 1 < (node->Windows).Size;
  if (((node->HostWindow == (ImGuiWindow_conflict *)0x0) &&
      (node->ParentNode == (ImGuiDockNode *)0x0)) && ((node->MergedFlags & 0x400U) == 0)) {
    uVar3 = *(ushort *)&node->field_0xbc;
    bVar7 = (uVar3 & 7) == 0;
    uVar5 = uVar3 | 2;
    if (!bVar7) {
      uVar5 = uVar3;
    }
    bVar8 = (uVar5 & 0x38) == 0;
    uVar3 = uVar5 | 0x10;
    if (!bVar8) {
      uVar3 = uVar5;
    }
    if (!(bool)(~(bVar8 || bVar7) & (uVar3 & 0x1c0) != 0)) {
      uVar5 = uVar3 | 0x80;
      if ((uVar3 & 0x1c0) != 0) {
        uVar5 = uVar3;
      }
      *(ushort *)&node->field_0xbc = uVar5;
    }
  }
  if (add_to_tab_bar) {
    pIVar6 = node->TabBar;
    if (pIVar6 == (ImGuiTabBar *)0x0) {
      DockNodeAddTabBar(node);
      IVar1 = node->SelectedTabId;
      pIVar6 = node->TabBar;
      pIVar6->NextSelectedTabId = IVar1;
      pIVar6->SelectedTabId = IVar1;
      for (i = 0; pIVar6 = node->TabBar, i < (node->Windows).Size + -1; i = i + 1) {
        ppIVar4 = ImVector<ImGuiWindow_*>::operator[](&node->Windows,i);
        TabBarAddTab(pIVar6,0,(ImGuiWindow *)*ppIVar4);
      }
    }
    TabBarAddTab(pIVar6,0x400000,local_28);
  }
  DockNodeUpdateVisibleFlag(node);
  if (node->HostWindow != (ImGuiWindow_conflict *)0x0) {
    UpdateWindowParentAndRootLinks
              ((ImGuiWindow_conflict *)local_28,local_28->Flags | 0x1000000,node->HostWindow);
  }
  return;
}

Assistant:

static void ImGui::DockNodeAddWindow(ImGuiDockNode* node, ImGuiWindow* window, bool add_to_tab_bar)
{
    ImGuiContext& g = *GImGui; (void)g;
    if (window->DockNode)
    {
        // Can overwrite an existing window->DockNode (e.g. pointing to a disabled DockSpace node)
        IM_ASSERT(window->DockNode->ID != node->ID);
        DockNodeRemoveWindow(window->DockNode, window, 0);
    }
    IM_ASSERT(window->DockNode == NULL || window->DockNodeAsHost == NULL);
    IMGUI_DEBUG_LOG_DOCKING("DockNodeAddWindow node 0x%08X window '%s'\n", node->ID, window->Name);

    // If more than 2 windows appeared on the same frame leading to the creation of a new hosting window,
    // we'll hide windows until the host window is ready. Hide the 1st window after its been output (so it is not visible for one frame).
    // We will call DockNodeHideWindowDuringHostWindowCreation() on ourselves in Begin()
    if (node->HostWindow == NULL && node->Windows.Size == 1 && node->Windows[0]->WasActive == false)
        DockNodeHideWindowDuringHostWindowCreation(node->Windows[0]);

    node->Windows.push_back(window);
    node->WantHiddenTabBarUpdate = true;
    window->DockNode = node;
    window->DockId = node->ID;
    window->DockIsActive = (node->Windows.Size > 1);
    window->DockTabWantClose = false;

    // When reactivating a node with one or two loose window, the window pos/size/viewport are authoritative over the node storage.
    // In particular it is important we init the viewport from the first window so we don't create two viewports and drop one.
    if (node->HostWindow == NULL && node->IsFloatingNode())
    {
        if (node->AuthorityForPos == ImGuiDataAuthority_Auto)
            node->AuthorityForPos = ImGuiDataAuthority_Window;
        if (node->AuthorityForSize == ImGuiDataAuthority_Auto)
            node->AuthorityForSize = ImGuiDataAuthority_Window;
        if (node->AuthorityForViewport == ImGuiDataAuthority_Auto)
            node->AuthorityForViewport = ImGuiDataAuthority_Window;
    }

    // Add to tab bar if requested
    if (add_to_tab_bar)
    {
        if (node->TabBar == NULL)
        {
            DockNodeAddTabBar(node);
            node->TabBar->SelectedTabId = node->TabBar->NextSelectedTabId = node->SelectedTabId;

            // Add existing windows
            for (int n = 0; n < node->Windows.Size - 1; n++)
                TabBarAddTab(node->TabBar, ImGuiTabItemFlags_None, node->Windows[n]);
        }
        TabBarAddTab(node->TabBar, ImGuiTabItemFlags_Unsorted, window);
    }

    DockNodeUpdateVisibleFlag(node);

    // Update this without waiting for the next time we Begin() in the window, so our host window will have the proper title bar color on its first frame.
    if (node->HostWindow)
        UpdateWindowParentAndRootLinks(window, window->Flags | ImGuiWindowFlags_ChildWindow, node->HostWindow);
}